

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

char * snappy::EmitCopy(char *op,size_t offset,int len)

{
  char *pcVar1;
  undefined4 local_1c;
  int len_local;
  size_t offset_local;
  char *op_local;
  
  offset_local = (size_t)op;
  for (local_1c = len; 0x43 < local_1c; local_1c = local_1c + -0x40) {
    offset_local = (size_t)EmitCopyLessThan64((char *)offset_local,offset,0x40);
  }
  if (0x40 < local_1c) {
    offset_local = (size_t)EmitCopyLessThan64((char *)offset_local,offset,0x3c);
    local_1c = local_1c + -0x3c;
  }
  pcVar1 = EmitCopyLessThan64((char *)offset_local,offset,local_1c);
  return pcVar1;
}

Assistant:

static inline char* EmitCopy(char* op, size_t offset, int len) {
  // Emit 64 byte copies but make sure to keep at least four bytes reserved
  while (PREDICT_FALSE(len >= 68)) {
    op = EmitCopyLessThan64(op, offset, 64);
    len -= 64;
  }

  // Emit an extra 60 byte copy if have too much data to fit in one copy
  if (len > 64) {
    op = EmitCopyLessThan64(op, offset, 60);
    len -= 60;
  }

  // Emit remainder
  op = EmitCopyLessThan64(op, offset, len);
  return op;
}